

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

string * __thiscall
spvtools::utils::
MakeString<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (string *__return_storage_ptr__,utils *this,
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          first,__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                last,bool assert_found_terminating_null)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  reference puVar4;
  char c;
  ulong uStack_48;
  uint32_t extracted_word;
  size_t byte_index;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_38;
  uint32_t word;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pos;
  size_t kCharsPerWord;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_20;
  bool assert_found_terminating_null_local;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  last_local;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  first_local;
  string *result;
  
  _Stack_20._M_current = first._M_current;
  last_local._M_current = (uint *)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pos._M_current = (uint *)0x4;
  _Stack_38._M_current = last_local._M_current;
  while (bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffc8,&stack0xffffffffffffffe0), bVar2) {
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&stack0xffffffffffffffc8);
    uVar1 = *puVar4;
    for (uStack_48 = 0; uStack_48 < 4; uStack_48 = uStack_48 + 1) {
      cVar3 = (char)(uVar1 >> ((byte)(uStack_48 << 3) & 0x1f));
      if (cVar3 == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&stack0xffffffffffffffc8);
  }
  if (((ulong)last._M_current & 1) == 0) {
    return __return_storage_ptr__;
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
               );
}

Assistant:

inline std::string MakeString(InputIt first, InputIt last,
                              bool assert_found_terminating_null = true) {
  std::string result;
  constexpr size_t kCharsPerWord = sizeof(*first);
  static_assert(kCharsPerWord == 4, "expect 4-byte word");

  for (InputIt pos = first; pos != last; ++pos) {
    uint32_t word = *pos;
    for (size_t byte_index = 0; byte_index < kCharsPerWord; byte_index++) {
      uint32_t extracted_word = (word >> (8 * byte_index)) & 0xFF;
      char c = static_cast<char>(extracted_word);
      if (c == 0) {
        return result;
      }
      result += c;
    }
  }
  assert(!assert_found_terminating_null &&
         "Did not find terminating null for the string.");
  (void)assert_found_terminating_null; /* No unused parameters in release
                                          builds. */
  return result;
}